

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O0

void Gia_ManDualAndN(Gia_Man_t *p,int *pLits,int n,int *LitZ)

{
  int iVar1;
  int iVar2;
  int local_34;
  int Lit;
  int LitOne;
  int LitZero;
  int i;
  int *LitZ_local;
  int n_local;
  int *pLits_local;
  Gia_Man_t *p_local;
  
  Lit = 0;
  local_34 = 0;
  *LitZ = 1;
  for (LitOne = 0; LitOne < n; LitOne = LitOne + 1) {
    iVar1 = Abc_LitNot(pLits[LitOne << 1]);
    iVar2 = Abc_LitNot(pLits[LitOne * 2 + 1]);
    iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
    Lit = Gia_ManHashOr(p,Lit,iVar1);
    local_34 = Gia_ManHashOr(p,local_34,pLits[LitOne * 2 + 1]);
    iVar1 = Gia_ManHashAnd(p,*LitZ,pLits[LitOne << 1]);
    *LitZ = iVar1;
  }
  iVar1 = Abc_LitNot(Lit);
  iVar1 = Gia_ManHashAnd(p,local_34,iVar1);
  LitZ[1] = iVar1;
  if (fForceZero != 0) {
    iVar1 = *LitZ;
    iVar2 = Abc_LitNot(LitZ[1]);
    iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
    *LitZ = iVar1;
  }
  return;
}

Assistant:

void Gia_ManDualAndN( Gia_Man_t * p, int * pLits, int n, int LitZ[2] )
{
    int i, LitZero = 0, LitOne = 0;
    LitZ[0] = 1;
    for ( i = 0; i < n; i++ )
    {
        int Lit = Gia_ManHashAnd( p, Abc_LitNot(pLits[2*i]), Abc_LitNot(pLits[2*i+1]) );
        LitZero = Gia_ManHashOr( p, LitZero, Lit );
        LitOne  = Gia_ManHashOr( p, LitOne,  pLits[2*i+1] );
        LitZ[0] = Gia_ManHashAnd( p, LitZ[0], pLits[2*i] );
    }
    LitZ[1] = Gia_ManHashAnd( p, LitOne, Abc_LitNot(LitZero) );
    
    if ( fForceZero ) LitZ[0]   = Gia_ManHashAnd( p, LitZ[0], Abc_LitNot(LitZ[1]) );
}